

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void OpenTapFile(path *tapename,int flagbyte)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68 [5];
  byte tap_data [3];
  string local_38;
  int local_14;
  path *ppStack_10;
  int flagbyte_local;
  path *tapename_local;
  
  local_14 = flagbyte;
  ppStack_10 = tapename;
  CloseTapFile();
  FP_tapout = SJ_fopen(ppStack_10,"r+b");
  if ((FILE *)FP_tapout == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_38,ppStack_10);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",pcVar2,PASS3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    iVar1 = fseek((FILE *)FP_tapout,0,2);
    if (iVar1 != 0) {
      std::filesystem::__cxx11::path::string((string *)local_68,ppStack_10);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Error("File seek end error in TAPOUT",pcVar2,FATAL);
      std::__cxx11::string::~string((string *)local_68);
    }
    lVar3 = ftell((FILE *)FP_tapout);
    tape_seek = (int)lVar3;
    tape_parity = local_14;
    tape_length = 2;
    local_6b = 0;
    local_6a = 0;
    local_69 = (undefined1)local_14;
    sVar4 = fwrite(&local_6b,1,3,(FILE *)FP_tapout);
    if (sVar4 != 3) {
      fclose((FILE *)FP_tapout);
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
  }
  return;
}

Assistant:

void OpenTapFile(const std::filesystem::path & tapename, int flagbyte)
{
	CloseTapFile();

	if (!FOPEN_ISOK(FP_tapout,tapename, "r+b")) {
		Error( "opening file for write", tapename.string().c_str());
		return;
	}
	if (fseek(FP_tapout, 0, SEEK_END)) Error("File seek end error in TAPOUT", tapename.string().c_str(), FATAL);

	tape_seek = ftell(FP_tapout);
	tape_parity = flagbyte;
	tape_length = 2;

	byte tap_data[3] = { 0, 0, (byte)flagbyte };

	if (sizeof(tap_data) != fwrite(tap_data, 1, sizeof(tap_data), FP_tapout)) {
		fclose(FP_tapout);
		Error("Write error (disk full?)", NULL, FATAL);
	}
}